

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O2

deBool qpXmlWriter_writeBase64(qpXmlWriter *writer,deUint8 *data,size_t numBytes)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char d [5];
  
  iVar2 = writer->xmlElementDepth;
  if (0x1f < writer->xmlElementDepth) {
    iVar2 = 0x20;
  }
  closePending(writer);
  bVar1 = true;
  iVar7 = 0;
  for (uVar5 = 0; uVar5 < numBytes; uVar5 = uVar5 + (long)(int)uVar8) {
    uVar6 = (int)numBytes - (int)uVar5;
    uVar8 = 3;
    if ((int)uVar6 < 3) {
      uVar8 = uVar6;
    }
    uVar3 = 0;
    if (uVar8 < 2) {
      bVar4 = 0;
    }
    else {
      bVar4 = data[uVar5 + 1];
      uVar3 = 0;
      if (uVar6 != 2) {
        uVar3 = (uint)data[uVar5 + 2];
      }
    }
    d[0] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[data[uVar5] >> 2];
    d[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)(bVar4 >> 4) | (data[uVar5] & 3) << 4];
    d[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uVar3 >> 6) + (bVar4 & 0xf) * 4];
    d[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 & 0x3f];
    d[4] = '\0';
    if (uVar8 < 3) {
      d[3] = '=';
    }
    if (uVar8 < 2) {
      d[2] = '=';
    }
    if (bVar1) {
      fputs(getIndentStr_s_indentStr + (0x20 - iVar2),(FILE *)writer->outputFile);
    }
    fputs(d,(FILE *)writer->outputFile);
    iVar7 = iVar7 + 4;
    bVar1 = 0x3f < iVar7;
    if (bVar1) {
      fputc(10,(FILE *)writer->outputFile);
      iVar7 = 0;
    }
  }
  if (0 < iVar7) {
    fputc(10,(FILE *)writer->outputFile);
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_writeBase64 (qpXmlWriter* writer, const deUint8* data, size_t numBytes)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	int			numWritten	= 0;
	size_t		srcNdx		= 0;
	deBool		writeIndent	= DE_TRUE;
	const char*	indentStr	= getIndentStr(writer->xmlElementDepth);

	DE_ASSERT(writer && data && (numBytes > 0));

	/* Close and pending writes. */
	closePending(writer);

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		size_t	numRead = (size_t)deMin32(3, (int)(numBytes - srcNdx));
		deUint8	s0 = data[srcNdx];
		deUint8	s1 = (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2 = (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[5];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];
		d[4] = 0;

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write indent (if needed). */
		if (writeIndent)
		{
			fprintf(writer->outputFile, "%s", indentStr);
			writeIndent = DE_FALSE;
		}

		/* Write data. */
		fprintf(writer->outputFile, "%s", &d[0]);

		/* EOL every now and then. */
		numWritten += 4;
		if (numWritten >= 64)
		{
			fprintf(writer->outputFile, "\n");
			numWritten = 0;
			writeIndent = DE_TRUE;
		}
	}

	/* Last EOL. */
	if (numWritten > 0)
		fprintf(writer->outputFile, "\n");

	DE_ASSERT(srcNdx == numBytes);
	return DE_TRUE;
}